

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall CMU462::StaticScene::Mesh::Mesh(Mesh *this,HalfedgeMesh *mesh,BSDF *bsdf)

{
  value_type pVVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  _func_int *p_Var4;
  mapped_type mVar5;
  ulong uVar6;
  bool bVar7;
  Size SVar8;
  mapped_type *pmVar9;
  ulong uVar10;
  Vector3D *pVVar11;
  reference ppVVar12;
  _func_int **pp_Var13;
  _func_int **in_RDX;
  SceneObject *in_RDI;
  HalfedgeCIter h;
  FaceCIter f_1;
  int i;
  Vertex *v;
  VertexCIter it;
  size_t vertexI;
  vector<const_CMU462::Vertex_*,_std::allocator<const_CMU462::Vertex_*>_> verts;
  unordered_map<const_CMU462::Vertex_*,_int,_std::hash<const_CMU462::Vertex_*>,_std::equal_to<const_CMU462::Vertex_*>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>_>
  vertexLabels;
  FaceCIter f;
  bool triNeeded;
  HalfedgeMesh _mesh;
  Face *in_stack_fffffffffffffcf8;
  VertexCIter in_stack_fffffffffffffd00;
  value_type *in_stack_fffffffffffffd08;
  Face *in_stack_fffffffffffffd10;
  HalfedgeMesh *in_stack_fffffffffffffd20;
  HalfedgeMesh *in_stack_fffffffffffffd28;
  HalfedgeMesh *in_stack_fffffffffffffd30;
  Vector3D *local_278;
  Vector3D *local_250;
  iterator local_180;
  _List_const_iterator<CMU462::Face> local_178;
  iterator local_170;
  _List_const_iterator<CMU462::Face> in_stack_fffffffffffffe98;
  _func_int *local_160;
  _func_int *local_158;
  _func_int *local_150;
  int local_144;
  iterator local_130;
  _List_const_iterator<CMU462::Vertex> local_128;
  iterator local_120;
  _List_const_iterator<CMU462::Vertex> local_118;
  ulong local_110;
  vector<const_CMU462::Vertex_*,_std::allocator<const_CMU462::Vertex_*>_> local_108 [3];
  _List_node_base *local_b8;
  _Self local_b0;
  _Self local_a8;
  byte local_9d;
  _func_int **local_18;
  
  local_18 = in_RDX;
  SceneObject::SceneObject(in_RDI);
  in_RDI->_vptr_SceneObject = (_func_int **)&PTR_get_primitives_003ba980;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x226127);
  HalfedgeMesh::HalfedgeMesh(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  local_9d = 0;
  local_a8._M_node =
       (_List_node_base *)HalfedgeMesh::facesBegin((HalfedgeMesh *)in_stack_fffffffffffffcf8);
  while( true ) {
    local_b0._M_node =
         (_List_node_base *)HalfedgeMesh::facesEnd((HalfedgeMesh *)in_stack_fffffffffffffcf8);
    bVar7 = std::operator!=(&local_a8,&local_b0);
    if (!bVar7) break;
    std::_List_const_iterator<CMU462::Face>::operator->
              ((_List_const_iterator<CMU462::Face> *)0x2261bf);
    SVar8 = Face::degree(in_stack_fffffffffffffd10);
    if (SVar8 != 3) {
      local_9d = 1;
    }
    local_b8 = (_List_node_base *)std::_List_const_iterator<CMU462::Face>::operator++(&local_a8,0);
  }
  if ((local_9d & 1) != 0) {
    HalfedgeMesh::triangulate(in_stack_fffffffffffffd20);
  }
  std::
  unordered_map<const_CMU462::Vertex_*,_int,_std::hash<const_CMU462::Vertex_*>,_std::equal_to<const_CMU462::Vertex_*>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>_>
  ::unordered_map((unordered_map<const_CMU462::Vertex_*,_int,_std::hash<const_CMU462::Vertex_*>,_std::equal_to<const_CMU462::Vertex_*>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>_>
                   *)0x226261);
  std::vector<const_CMU462::Vertex_*,_std::allocator<const_CMU462::Vertex_*>_>::vector
            ((vector<const_CMU462::Vertex_*,_std::allocator<const_CMU462::Vertex_*>_> *)0x22626e);
  local_110 = 0;
  local_120._M_node =
       (_List_node_base *)HalfedgeMesh::verticesBegin((HalfedgeMesh *)in_stack_fffffffffffffcf8);
  std::_List_const_iterator<CMU462::Vertex>::_List_const_iterator(&local_118,&local_120);
  while( true ) {
    local_130._M_node =
         (_List_node_base *)HalfedgeMesh::verticesEnd((HalfedgeMesh *)in_stack_fffffffffffffcf8);
    std::_List_const_iterator<CMU462::Vertex>::_List_const_iterator(&local_128,&local_130);
    bVar7 = std::operator!=(&local_118,&local_128);
    uVar6 = local_110;
    if (!bVar7) break;
    std::_List_const_iterator<CMU462::Vertex>::operator*
              ((_List_const_iterator<CMU462::Vertex> *)0x22631d);
    std::vector<const_CMU462::Vertex_*,_std::allocator<const_CMU462::Vertex_*>_>::push_back
              ((vector<const_CMU462::Vertex_*,_std::allocator<const_CMU462::Vertex_*>_> *)
               in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
    mVar5 = (mapped_type)local_110;
    pmVar9 = std::
             unordered_map<const_CMU462::Vertex_*,_int,_std::hash<const_CMU462::Vertex_*>,_std::equal_to<const_CMU462::Vertex_*>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>_>
             ::operator[]((unordered_map<const_CMU462::Vertex_*,_int,_std::hash<const_CMU462::Vertex_*>,_std::equal_to<const_CMU462::Vertex_*>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>_>
                           *)in_stack_fffffffffffffd00._M_node,(key_type *)in_stack_fffffffffffffcf8
                         );
    *pmVar9 = mVar5;
    local_110 = local_110 + 1;
    std::_List_const_iterator<CMU462::Vertex>::operator++(&local_118,0);
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_110;
  uVar10 = SUB168(auVar2 * ZEXT816(0x18),0);
  if (SUB168(auVar2 * ZEXT816(0x18),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  pVVar11 = (Vector3D *)operator_new__(uVar10);
  if (uVar6 != 0) {
    local_250 = pVVar11;
    do {
      Vector3D::Vector3D(local_250);
      local_250 = local_250 + 1;
    } while (local_250 != pVVar11 + uVar6);
  }
  uVar6 = local_110;
  in_RDI[1]._vptr_SceneObject = (_func_int **)pVVar11;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_110;
  uVar10 = SUB168(auVar3 * ZEXT816(0x18),0);
  if (SUB168(auVar3 * ZEXT816(0x18),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  pVVar11 = (Vector3D *)operator_new__(uVar10);
  if (uVar6 != 0) {
    local_278 = pVVar11;
    do {
      Vector3D::Vector3D(local_278);
      local_278 = local_278 + 1;
    } while (local_278 != pVVar11 + uVar6);
  }
  in_RDI[2]._vptr_SceneObject = (_func_int **)pVVar11;
  for (local_144 = 0; (ulong)(long)local_144 < local_110; local_144 = local_144 + 1) {
    ppVVar12 = std::vector<const_CMU462::Vertex_*,_std::allocator<const_CMU462::Vertex_*>_>::
               operator[](local_108,(long)local_144);
    pVVar1 = *ppVVar12;
    pp_Var13 = in_RDI[1]._vptr_SceneObject;
    pp_Var13[(long)local_144 * 3 + 2] = (_func_int *)(pVVar1->position).z;
    p_Var4 = (_func_int *)(pVVar1->position).y;
    pp_Var13 = pp_Var13 + (long)local_144 * 3;
    *pp_Var13 = (_func_int *)(pVVar1->position).x;
    pp_Var13[1] = p_Var4;
    std::vector<const_CMU462::Vertex_*,_std::allocator<const_CMU462::Vertex_*>_>::operator[]
              (local_108,(long)local_144);
    Vertex::normal((Vertex *)in_stack_fffffffffffffe98._M_node);
    pp_Var13 = in_RDI[2]._vptr_SceneObject + (long)local_144 * 3;
    *pp_Var13 = local_160;
    pp_Var13[1] = local_158;
    pp_Var13[2] = local_150;
  }
  local_170._M_node =
       (_List_node_base *)HalfedgeMesh::facesBegin((HalfedgeMesh *)in_stack_fffffffffffffcf8);
  std::_List_const_iterator<CMU462::Face>::_List_const_iterator
            ((_List_const_iterator<CMU462::Face> *)&stack0xfffffffffffffe98,&local_170);
  while( true ) {
    local_180._M_node =
         (_List_node_base *)HalfedgeMesh::facesEnd((HalfedgeMesh *)in_stack_fffffffffffffcf8);
    std::_List_const_iterator<CMU462::Face>::_List_const_iterator(&local_178,&local_180);
    bVar7 = std::operator!=((_Self *)&stack0xfffffffffffffe98,&local_178);
    if (!bVar7) break;
    std::_List_const_iterator<CMU462::Face>::operator->
              ((_List_const_iterator<CMU462::Face> *)0x2266fa);
    Face::halfedge(in_stack_fffffffffffffcf8);
    std::_List_const_iterator<CMU462::Halfedge>::operator->
              ((_List_const_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffd00._M_node);
    Halfedge::vertex((Halfedge *)in_stack_fffffffffffffcf8);
    std::_List_const_iterator<CMU462::Vertex>::operator*
              ((_List_const_iterator<CMU462::Vertex> *)0x22675d);
    std::
    unordered_map<const_CMU462::Vertex_*,_int,_std::hash<const_CMU462::Vertex_*>,_std::equal_to<const_CMU462::Vertex_*>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>_>
    ::operator[]((unordered_map<const_CMU462::Vertex_*,_int,_std::hash<const_CMU462::Vertex_*>,_std::equal_to<const_CMU462::Vertex_*>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>_>
                  *)in_stack_fffffffffffffd00._M_node,(key_type *)in_stack_fffffffffffffcf8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffffd00._M_node,(value_type_conflict *)in_stack_fffffffffffffcf8);
    std::_List_const_iterator<CMU462::Halfedge>::operator->
              ((_List_const_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffd00._M_node);
    Halfedge::next((Halfedge *)in_stack_fffffffffffffcf8);
    std::_List_const_iterator<CMU462::Halfedge>::operator->
              ((_List_const_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffd00._M_node);
    Halfedge::vertex((Halfedge *)in_stack_fffffffffffffcf8);
    std::_List_const_iterator<CMU462::Vertex>::operator*
              ((_List_const_iterator<CMU462::Vertex> *)0x226815);
    std::
    unordered_map<const_CMU462::Vertex_*,_int,_std::hash<const_CMU462::Vertex_*>,_std::equal_to<const_CMU462::Vertex_*>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>_>
    ::operator[]((unordered_map<const_CMU462::Vertex_*,_int,_std::hash<const_CMU462::Vertex_*>,_std::equal_to<const_CMU462::Vertex_*>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>_>
                  *)in_stack_fffffffffffffd00._M_node,(key_type *)in_stack_fffffffffffffcf8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffffd00._M_node,(value_type_conflict *)in_stack_fffffffffffffcf8);
    in_stack_fffffffffffffd10 = (Face *)(in_RDI + 4);
    std::_List_const_iterator<CMU462::Halfedge>::operator->
              ((_List_const_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffd00._M_node);
    Halfedge::next((Halfedge *)in_stack_fffffffffffffcf8);
    std::_List_const_iterator<CMU462::Halfedge>::operator->
              ((_List_const_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffd00._M_node);
    Halfedge::next((Halfedge *)in_stack_fffffffffffffcf8);
    std::_List_const_iterator<CMU462::Halfedge>::operator->
              ((_List_const_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffd00._M_node);
    in_stack_fffffffffffffd00 = Halfedge::vertex((Halfedge *)in_stack_fffffffffffffcf8);
    std::_List_const_iterator<CMU462::Vertex>::operator*
              ((_List_const_iterator<CMU462::Vertex> *)0x2268f6);
    in_stack_fffffffffffffcf8 =
         (Face *)std::
                 unordered_map<const_CMU462::Vertex_*,_int,_std::hash<const_CMU462::Vertex_*>,_std::equal_to<const_CMU462::Vertex_*>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>_>
                 ::operator[]((unordered_map<const_CMU462::Vertex_*,_int,_std::hash<const_CMU462::Vertex_*>,_std::equal_to<const_CMU462::Vertex_*>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>_>
                               *)in_stack_fffffffffffffd00._M_node,
                              (key_type *)in_stack_fffffffffffffcf8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffffd00._M_node,(value_type_conflict *)in_stack_fffffffffffffcf8);
    std::_List_const_iterator<CMU462::Face>::operator++
              ((_List_const_iterator<CMU462::Face> *)&stack0xfffffffffffffe98,0);
  }
  in_RDI[3]._vptr_SceneObject = local_18;
  std::vector<const_CMU462::Vertex_*,_std::allocator<const_CMU462::Vertex_*>_>::~vector
            ((vector<const_CMU462::Vertex_*,_std::allocator<const_CMU462::Vertex_*>_> *)
             in_stack_fffffffffffffd10);
  std::
  unordered_map<const_CMU462::Vertex_*,_int,_std::hash<const_CMU462::Vertex_*>,_std::equal_to<const_CMU462::Vertex_*>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>_>
  ::~unordered_map((unordered_map<const_CMU462::Vertex_*,_int,_std::hash<const_CMU462::Vertex_*>,_std::equal_to<const_CMU462::Vertex_*>,_std::allocator<std::pair<const_CMU462::Vertex_*const,_int>_>_>
                    *)0x226988);
  HalfedgeMesh::~HalfedgeMesh((HalfedgeMesh *)in_stack_fffffffffffffd00._M_node);
  return;
}

Assistant:

Mesh::Mesh(const HalfedgeMesh& mesh, BSDF* bsdf) {
  // triangulate mesh before sending to visualization or render mode
  HalfedgeMesh _mesh(mesh);

  // Triangulate if needed
  bool triNeeded = false;
  for (auto f = mesh.facesBegin(); f != mesh.facesEnd(); f++) {
    if(f->degree() != 3) {
      triNeeded = true;
    }
  }
  if(triNeeded) {
    _mesh.triangulate();
  }

  unordered_map<const Vertex*, int> vertexLabels;
  vector<const Vertex*> verts;

  size_t vertexI = 0;
  for (VertexCIter it = _mesh.verticesBegin(); it != _mesh.verticesEnd();
       it++) {
    const Vertex* v = &*it;
    verts.push_back(v);
    vertexLabels[v] = vertexI;
    vertexI++;
  }

  positions = new Vector3D[vertexI];
  normals = new Vector3D[vertexI];
  for (int i = 0; i < vertexI; i++) {
    positions[i] = verts[i]->position;
    normals[i] = verts[i]->normal();
  }

  for (FaceCIter f = _mesh.facesBegin(); f != _mesh.facesEnd(); f++) {
    HalfedgeCIter h = f->halfedge();
    indices.push_back(vertexLabels[&*h->vertex()]);
    indices.push_back(vertexLabels[&*h->next()->vertex()]);
    indices.push_back(vertexLabels[&*h->next()->next()->vertex()]);
  }

  this->bsdf = bsdf;
}